

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O2

void __thiscall wasm::ReorderFunctions::~ReorderFunctions(ReorderFunctions *this)

{
  Pass::~Pass(&this->super_Pass);
  operator_delete(this,0x30);
  return;
}

Assistant:

bool requiresNonNullableLocalFixups() override { return false; }